

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void __thiscall
kratos::VarException::VarException
          (VarException *this,string *message,
          vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes)

{
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes_local;
  string *message_local;
  VarException *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__VarException_00595f00;
  print_nodes<kratos::IRNode_const*>(nodes);
  return;
}

Assistant:

VarException::VarException(const std::string& message,
                           const std::vector<const IRNode*>& nodes) noexcept
    : std::runtime_error(message) {
    print_nodes(nodes);
}